

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O0

size_t license::mstrnlen_s(char *szptr,size_t maxsize)

{
  size_t sVar1;
  char *local_28;
  size_t count;
  size_t maxsize_local;
  char *szptr_local;
  
  if (szptr == (char *)0x0) {
    szptr_local = (char *)0x0;
  }
  else {
    local_28 = (char *)0x0;
    count = maxsize;
    maxsize_local = (size_t)szptr;
    while( true ) {
      sVar1 = count;
      if (*(char *)maxsize_local != '\0') {
        count = count - 1;
      }
      if (*(char *)maxsize_local == '\0' || sVar1 == 0) break;
      local_28 = local_28 + 1;
      maxsize_local = maxsize_local + 1;
    }
    szptr_local = local_28;
  }
  return (size_t)szptr_local;
}

Assistant:

size_t mstrnlen_s(const char *szptr, size_t maxsize) {
	if (szptr == nullptr) {
		return 0;
	}
	size_t count = 0;
	while (*szptr++ && maxsize--) {
		count++;
	}
	return count;
}